

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall mkvparser::Tags::Tag::Clear(Tag *this)

{
  int iVar1;
  
  iVar1 = this->m_simple_tags_count;
  while (0 < iVar1) {
    this->m_simple_tags_count = iVar1 - 1U;
    SimpleTag::Clear(this->m_simple_tags + (iVar1 - 1U));
    iVar1 = this->m_simple_tags_count;
  }
  if (this->m_simple_tags != (SimpleTag *)0x0) {
    operator_delete__(&this->m_simple_tags[-1].m_tag_string);
  }
  this->m_simple_tags = (SimpleTag *)0x0;
  this->m_simple_tags_size = 0;
  return;
}

Assistant:

void Tags::Tag::Clear() {
  while (m_simple_tags_count > 0) {
    SimpleTag& d = m_simple_tags[--m_simple_tags_count];
    d.Clear();
  }

  delete[] m_simple_tags;
  m_simple_tags = NULL;

  m_simple_tags_size = 0;
}